

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

int cdef_find_dir_sse4_1(uint16_t *img,int stride,int32_t *var,int coeff_shift)

{
  ushort uVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  long lVar8;
  undefined4 uVar9;
  uint extraout_XMM0_Da;
  undefined8 extraout_XMM0_Qa;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  undefined8 extraout_XMM0_Qb;
  uint extraout_XMM0_Dd;
  undefined4 uVar11;
  uint uVar12;
  uint uVar17;
  uint uVar18;
  undefined1 in_XMM1 [16];
  undefined1 auVar14 [16];
  uint uVar19;
  undefined1 auVar16 [16];
  uint uVar20;
  uint uVar26;
  uint uVar27;
  undefined1 in_XMM2 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined4 uVar33;
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined4 uVar41;
  undefined4 uVar44;
  undefined1 auVar48 [16];
  int32_t cost [8];
  v128 lines [8];
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  int32_t local_b8 [4];
  int32_t local_a8 [4];
  longlong local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 auVar10 [16];
  undefined1 auVar13 [12];
  undefined1 auVar15 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar42 [12];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  
  lVar8 = 0;
  auVar14 = pmovsxbw(in_XMM1,0x8080808080808080);
  for (; lVar8 != 0x80; lVar8 = lVar8 + 0x10) {
    auVar21 = lddqu(in_XMM2,*(undefined1 (*) [16])img);
    auVar21 = psraw(auVar21,ZEXT416((uint)coeff_shift));
    in_XMM2._0_2_ = auVar21._0_2_ + auVar14._0_2_;
    in_XMM2._2_2_ = auVar21._2_2_ + auVar14._2_2_;
    in_XMM2._4_2_ = auVar21._4_2_ + auVar14._4_2_;
    in_XMM2._6_2_ = auVar21._6_2_ + auVar14._6_2_;
    in_XMM2._8_2_ = auVar21._8_2_ + auVar14._8_2_;
    in_XMM2._10_2_ = auVar21._10_2_ + auVar14._10_2_;
    in_XMM2._12_2_ = auVar21._12_2_ + auVar14._12_2_;
    in_XMM2._14_2_ = auVar21._14_2_ + auVar14._14_2_;
    *(undefined1 (*) [16])((long)&local_98 + lVar8) = in_XMM2;
    img = (uint16_t *)(*(undefined1 (*) [16])img + (long)stride * 2);
  }
  compute_directions((v128 *)&local_98,local_a8);
  auVar2._8_4_ = uStack_90;
  auVar2._0_8_ = local_98;
  auVar14._8_8_ = uStack_70;
  auVar14._0_8_ = local_78;
  auVar25._12_2_ = (short)((ulong)local_98 >> 0x30);
  auVar25._0_12_ = auVar2;
  auVar25._14_2_ = uStack_84._2_2_;
  auVar24._12_4_ = auVar25._12_4_;
  auVar24._0_10_ = auVar2._0_10_;
  auVar24._10_2_ = (undefined2)uStack_84;
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._8_2_ = (short)((ulong)local_98 >> 0x20);
  auVar23._0_8_ = local_98;
  auVar4._4_8_ = auVar23._8_8_;
  auVar4._2_2_ = local_88._2_2_;
  auVar4._0_2_ = (short)((ulong)local_98 >> 0x10);
  auVar22._0_4_ = CONCAT22((undefined2)local_88,(short)local_98);
  auVar22._4_12_ = auVar4;
  auVar37._0_12_ = auVar14._0_12_;
  auVar37._12_2_ = (short)((ulong)local_78 >> 0x30);
  auVar37._14_2_ = local_68._6_2_;
  auVar36._12_4_ = auVar37._12_4_;
  auVar36._0_10_ = auVar14._0_10_;
  auVar36._10_2_ = local_68._4_2_;
  auVar35._10_6_ = auVar36._10_6_;
  auVar35._8_2_ = (short)((ulong)local_78 >> 0x20);
  auVar35._0_8_ = local_78;
  auVar5._4_8_ = auVar35._8_8_;
  auVar5._2_2_ = local_68._2_2_;
  auVar5._0_2_ = (short)((ulong)local_78 >> 0x10);
  uVar9 = CONCAT22((undefined2)uStack_80,(short)uStack_90);
  auVar10._0_8_ = CONCAT26(uStack_80._2_2_,CONCAT24((short)((uint)uStack_90 >> 0x10),uVar9));
  auVar10._8_2_ = (short)uStack_8c;
  auVar10._10_2_ = (undefined2)uStack_7c;
  auVar10._12_2_ = (short)((uint)uStack_8c >> 0x10);
  auVar10._14_2_ = uStack_7c._2_2_;
  uVar33 = CONCAT22((undefined2)uStack_60,(short)uStack_70);
  auVar34._0_8_ = CONCAT26(uStack_60._2_2_,CONCAT24((short)((ulong)uStack_70 >> 0x10),uVar33));
  auVar34._8_2_ = (short)((ulong)uStack_70 >> 0x20);
  auVar34._10_2_ = uStack_60._4_2_;
  auVar34._12_2_ = (short)((ulong)uStack_70 >> 0x30);
  auVar34._14_2_ = uStack_60._6_2_;
  auVar3._8_4_ = uStack_50;
  auVar3._0_8_ = local_58;
  auVar31._12_2_ = (short)((ulong)local_58 >> 0x30);
  auVar31._0_12_ = auVar3;
  auVar31._14_2_ = uStack_44._2_2_;
  auVar30._12_4_ = auVar31._12_4_;
  auVar30._0_10_ = auVar3._0_10_;
  auVar30._10_2_ = (undefined2)uStack_44;
  auVar29._10_6_ = auVar30._10_6_;
  auVar29._8_2_ = (short)((ulong)local_58 >> 0x20);
  auVar29._0_8_ = local_58;
  auVar6._4_8_ = auVar29._8_8_;
  auVar6._2_2_ = local_48._2_2_;
  auVar6._0_2_ = (short)((ulong)local_58 >> 0x10);
  auVar28._0_4_ = CONCAT22((undefined2)local_48,(short)local_58);
  auVar28._4_12_ = auVar6;
  auVar21._8_8_ = uStack_30;
  auVar21._0_8_ = local_38;
  auVar47._0_12_ = auVar21._0_12_;
  auVar47._12_2_ = (short)((ulong)local_38 >> 0x30);
  auVar47._14_2_ = local_28._6_2_;
  auVar46._12_4_ = auVar47._12_4_;
  auVar46._0_10_ = auVar21._0_10_;
  auVar46._10_2_ = local_28._4_2_;
  auVar45._10_6_ = auVar46._10_6_;
  auVar45._8_2_ = (short)((ulong)local_38 >> 0x20);
  auVar45._0_8_ = local_38;
  auVar7._4_8_ = auVar45._8_8_;
  auVar7._2_2_ = local_28._2_2_;
  auVar7._0_2_ = (short)((ulong)local_38 >> 0x10);
  uVar44 = CONCAT22((undefined2)local_28,(short)local_38);
  uVar11 = CONCAT22((undefined2)uStack_40,(short)uStack_50);
  auVar13._0_8_ = CONCAT26(uStack_40._2_2_,CONCAT24((short)((uint)uStack_50 >> 0x10),uVar11));
  auVar13._8_2_ = (short)uStack_4c;
  auVar13._10_2_ = (undefined2)uStack_3c;
  auVar15._12_2_ = (short)((uint)uStack_4c >> 0x10);
  auVar15._0_12_ = auVar13;
  auVar15._14_2_ = uStack_3c._2_2_;
  uVar41 = CONCAT22((undefined2)uStack_20,(short)uStack_30);
  auVar42._0_8_ = CONCAT26(uStack_20._2_2_,CONCAT24((short)((ulong)uStack_30 >> 0x10),uVar41));
  auVar42._8_2_ = (short)((ulong)uStack_30 >> 0x20);
  auVar42._10_2_ = uStack_20._4_2_;
  auVar43._12_2_ = (short)((ulong)uStack_30 >> 0x30);
  auVar43._0_12_ = auVar42;
  auVar43._14_2_ = uStack_20._6_2_;
  auVar39._0_8_ = auVar22._0_8_;
  auVar39._8_4_ = auVar4._0_4_;
  auVar39._12_4_ = auVar5._0_4_;
  local_38 = auVar39._8_8_;
  local_28 = CONCAT44(CONCAT22((undefined2)local_68,(short)local_78),auVar22._0_4_);
  auVar40._0_8_ = auVar28._0_8_;
  auVar40._8_4_ = auVar6._0_4_;
  auVar40._12_4_ = auVar7._0_4_;
  uStack_30 = auVar40._8_8_;
  uStack_20 = CONCAT44(uVar44,auVar28._0_4_);
  uStack_40 = auVar29._8_4_;
  uStack_3c = auVar45._8_4_;
  auVar38._8_4_ = (int)((ulong)auVar10._0_8_ >> 0x20);
  auVar38._0_8_ = auVar10._0_8_;
  auVar38._12_4_ = (int)((ulong)auVar34._0_8_ >> 0x20);
  local_78 = auVar38._8_8_;
  local_68 = CONCAT44(uVar33,uVar9);
  auVar48._8_4_ = (int)((ulong)auVar13._0_8_ >> 0x20);
  auVar48._0_8_ = auVar13._0_8_;
  auVar48._12_4_ = (int)((ulong)auVar42._0_8_ >> 0x20);
  uStack_70 = auVar48._8_8_;
  uStack_60 = CONCAT44(uVar41,uVar11);
  uStack_90 = auVar10._12_4_;
  uStack_8c = auVar34._12_4_;
  uStack_80 = auVar13._8_4_;
  uStack_7c = auVar42._8_4_;
  local_88 = auVar15._12_4_;
  uStack_84 = auVar43._12_4_;
  uStack_50 = auVar24._12_4_;
  uStack_4c = auVar36._12_4_;
  local_48 = auVar30._12_4_;
  uStack_44 = auVar46._12_4_;
  compute_directions((v128 *)&local_98,local_b8);
  local_c8 = (uint)extraout_XMM0_Qa;
  uStack_c4 = (uint)((ulong)extraout_XMM0_Qa >> 0x20);
  uStack_c0 = (uint)extraout_XMM0_Qb;
  uStack_bc = (uint)((ulong)extraout_XMM0_Qb >> 0x20);
  uVar12 = ((int)extraout_XMM0_Da < (int)local_c8) * local_c8 |
           ((int)extraout_XMM0_Da >= (int)local_c8) * extraout_XMM0_Da;
  uVar17 = ((int)extraout_XMM0_Db < (int)uStack_c4) * uStack_c4 |
           ((int)extraout_XMM0_Db >= (int)uStack_c4) * extraout_XMM0_Db;
  uVar18 = ((int)extraout_XMM0_Dc < (int)uStack_c0) * uStack_c0 |
           ((int)extraout_XMM0_Dc >= (int)uStack_c0) * extraout_XMM0_Dc;
  uVar19 = ((int)extraout_XMM0_Dd < (int)uStack_bc) * uStack_bc |
           ((int)extraout_XMM0_Dd >= (int)uStack_bc) * extraout_XMM0_Dd;
  uVar20 = ((int)uVar18 < (int)uVar12) * uVar12 | ((int)uVar18 >= (int)uVar12) * uVar18;
  uVar26 = ((int)uVar19 < (int)uVar17) * uVar17 | ((int)uVar19 >= (int)uVar17) * uVar19;
  uVar27 = ((int)uVar12 < (int)uVar18) * uVar18 | ((int)uVar12 >= (int)uVar18) * uVar12;
  uVar19 = ((int)uVar17 < (int)uVar19) * uVar19 | ((int)uVar17 >= (int)uVar19) * uVar17;
  uVar18 = ((int)uVar26 < (int)uVar20) * uVar20 | ((int)uVar26 >= (int)uVar20) * uVar26;
  uVar12 = ((int)uVar27 < (int)uVar26) * uVar26 | ((int)uVar27 >= (int)uVar26) * uVar27;
  uVar17 = ((int)uVar19 < (int)uVar27) * uVar27 | ((int)uVar19 >= (int)uVar27) * uVar19;
  uVar19 = ((int)uVar20 < (int)uVar19) * uVar19 | ((int)uVar20 >= (int)uVar19) * uVar20;
  auVar32._0_4_ = -(uint)(local_c8 == uVar18);
  auVar32._4_4_ = -(uint)(uStack_c4 == uVar12);
  auVar32._8_4_ = -(uint)(uStack_c0 == uVar17);
  auVar32._12_4_ = -(uint)(uStack_bc == uVar19);
  auVar16._0_4_ = -(uint)(uVar18 == extraout_XMM0_Da);
  auVar16._4_4_ = -(uint)(uVar12 == extraout_XMM0_Db);
  auVar16._8_4_ = -(uint)(uVar17 == extraout_XMM0_Dc);
  auVar16._12_4_ = -(uint)(uVar19 == extraout_XMM0_Dd);
  auVar14 = packssdw(auVar16,auVar32);
  auVar14 = packsswb(auVar14,auVar14);
  uVar1 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar14[0xf] >> 7) << 0xf;
  uVar17 = uVar1 - 1 ^ (uint)uVar1;
  uVar12 = 0x1f;
  if (uVar17 != 0) {
    for (; uVar17 >> uVar12 == 0; uVar12 = uVar12 - 1) {
    }
  }
  *var = (int)(uVar18 - local_b8[uVar12 & 7 ^ 4]) >> 10;
  return uVar12;
}

Assistant:

int SIMD_FUNC(cdef_find_dir)(const uint16_t *img, int stride, int32_t *var,
                             int coeff_shift) {
  int i;
  int32_t cost[8];
  int32_t best_cost = 0;
  int best_dir = 0;
  v128 lines[8];
  for (i = 0; i < 8; i++) {
    lines[i] = v128_load_unaligned(&img[i * stride]);
    lines[i] =
        v128_sub_16(v128_shr_s16(lines[i], coeff_shift), v128_dup_16(128));
  }

  /* Compute "mostly vertical" directions. */
  v128 dir47 = compute_directions(lines, cost + 4);

  array_reverse_transpose_8x8(lines, lines);

  /* Compute "mostly horizontal" directions. */
  v128 dir03 = compute_directions(lines, cost);

  v128 max = v128_max_s32(dir03, dir47);
  max = v128_max_s32(max, v128_align(max, max, 8));
  max = v128_max_s32(max, v128_align(max, max, 4));
  best_cost = v128_low_u32(max);
  v128 t =
      v128_pack_s32_s16(v128_cmpeq_32(max, dir47), v128_cmpeq_32(max, dir03));
  best_dir = v128_movemask_8(v128_pack_s16_s8(t, t));
  best_dir = get_msb(best_dir ^ (best_dir - 1));  // Count trailing zeros

  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var = best_cost - cost[(best_dir + 4) & 7];
  /* We'd normally divide by 840, but dividing by 1024 is close enough
     for what we're going to do with this. */
  *var >>= 10;
  return best_dir;
}